

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinject.h
# Opt level: O0

shared_ptr<ICrawler> __thiscall
cinject::
CastInstanceRetriever<Snake,_ICrawler,_cinject::InstanceStorage<Snake,_cinject::ConstructorFactory<Snake,_void>_>_>
::forwardInstance(CastInstanceRetriever<Snake,_ICrawler,_cinject::InstanceStorage<Snake,_cinject::ConstructorFactory<Snake,_void>_>_>
                  *this,InjectionContext *context)

{
  element_type *peVar1;
  undefined8 in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<ICrawler> sVar2;
  shared_ptr<Snake> local_30;
  undefined8 local_20;
  InjectionContext *context_local;
  CastInstanceRetriever<Snake,_ICrawler,_cinject::InstanceStorage<Snake,_cinject::ConstructorFactory<Snake,_void>_>_>
  *this_local;
  
  local_20 = in_RDX;
  context_local = context;
  this_local = this;
  peVar1 = std::
           __shared_ptr_access<cinject::InstanceStorage<Snake,_cinject::ConstructorFactory<Snake,_void>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cinject::InstanceStorage<Snake,_cinject::ConstructorFactory<Snake,_void>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&context->componentStack_);
  (**peVar1->_vptr_InstanceStorage)(&local_30,peVar1,local_20);
  std::dynamic_pointer_cast<ICrawler,Snake>((shared_ptr<Snake> *)this);
  std::shared_ptr<Snake>::~shared_ptr(&local_30);
  sVar2.super___shared_ptr<ICrawler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<ICrawler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<ICrawler>)sVar2.super___shared_ptr<ICrawler,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<TInterface> forwardInstance(InjectionContext* context) override
    {
        return std::dynamic_pointer_cast<TInterface>(storage_->getInstance(context));
    }